

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O0

int __thiscall AGSSock::Pool::remove(Pool *this,char *__filename)

{
  int extraout_EAX;
  size_type sVar1;
  __sighandler_t __handler;
  Lock *__x;
  Lock local_20;
  Lock lock;
  Socket *sock_local;
  Pool *this_local;
  
  lock.mutex_ = (Mutex *)__filename;
  AGSSockAPI::Mutex::Lock::Lock(&local_20,&this->guard_);
  __x = &lock;
  sVar1 = std::
          unordered_set<AGSSock::Socket_*,_std::hash<AGSSock::Socket_*>,_std::equal_to<AGSSock::Socket_*>,_std::allocator<AGSSock::Socket_*>_>
          ::erase(&this->sockets_,(key_type *)__x);
  if (sVar1 != 0) {
    AGSSockAPI::Beacon::signal(&this->beacon_,(int)__x,__handler);
  }
  AGSSockAPI::Mutex::Lock::~Lock(&local_20);
  return extraout_EAX;
}

Assistant:

void Pool::remove(Socket *sock)
{
	Mutex::Lock lock(guard_);

	if (sockets_.erase(sock))
		beacon_.signal();

	// Signalling might not be necessary for windows: closing sockets might
	// already trigger select.
}